

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O2

void sun_prog_ilopheth(AREA_DATA_conflict *area)

{
  string *this;
  allocator<char> local_92;
  allocator<char> local_91;
  AREA_DATA_conflict *area_local;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  area_local = area;
  if (sun == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"sun_prog_ilopheth",&local_91);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"zone_echo_queue",&local_92);
    CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[66]>
              (&RS.Queue,0xf,&local_68,&local_88,zone_echo_queue,&area_local,
               (char (*) [66])"The forest grows still, as the night sky settles over the valley.");
    std::__cxx11::string::~string((string *)&local_88);
    this = &local_68;
  }
  else {
    if (sun != 1) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"sun_prog_ilopheth",&local_91);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"zone_echo_queue",&local_92);
    CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89]>
              (&RS.Queue,0xf,&local_28,&local_48,zone_echo_queue,&area_local,
               (char (*) [89])
               "With the beginning of the day sounds of life fill the valley, as the forest comes alive."
              );
    std::__cxx11::string::~string((string *)&local_48);
    this = &local_28;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void sun_prog_ilopheth(AREA_DATA *area)
{
	switch (sun)
	{
		case SolarPosition::Sunrise:
			RS.Queue.AddToQueue(15, "sun_prog_ilopheth", "zone_echo_queue", zone_echo_queue, area, "With the beginning of the day sounds of life fill the valley, as the forest comes alive.");
			break;
		case SolarPosition::Sunset:
			RS.Queue.AddToQueue(15, "sun_prog_ilopheth", "zone_echo_queue", zone_echo_queue, area, "The forest grows still, as the night sky settles over the valley.");
			break;
	}
}